

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

bool __thiscall
sptk::SymmetricMatrix::SetDiagonal
          (SymmetricMatrix *this,vector<double,_std::allocator<double>_> *diagonal_elements)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference ppdVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int i;
  int local_1c;
  bool local_1;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar2 == (long)*(int *)(in_RDI + 8)) {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 8); local_1c = local_1c + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
      vVar1 = *pvVar3;
      ppdVar4 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                           (long)local_1c);
      (*ppdVar4)[local_1c] = vVar1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SymmetricMatrix::SetDiagonal(
    const std::vector<double>& diagonal_elements) const {
  if (diagonal_elements.size() != static_cast<std::size_t>(num_dimension_)) {
    return false;
  }
  for (int i(0); i < num_dimension_; ++i) {
    index_[i][i] = diagonal_elements[i];
  }
  return true;
}